

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_getmetatable(jit_State *J,RecordFFData *rd)

{
  int iVar1;
  TValue local_98;
  RecordIndex ix;
  TRef tr;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  ix.oldv._0_4_ = *J->base;
  if ((TRef)ix.oldv != 0) {
    local_98 = *rd->argv;
    ix.idxchain = (TRef)ix.oldv;
    iVar1 = lj_record_mm_lookup(J,(RecordIndex *)&local_98.gcr,MM_metatable);
    if (iVar1 == 0) {
      *J->base = ix.key;
    }
    else {
      *J->base = ix.val;
    }
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_getmetatable(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (tr) {
    RecordIndex ix;
    ix.tab = tr;
    copyTV(J->L, &ix.tabv, &rd->argv[0]);
    if (lj_record_mm_lookup(J, &ix, MM_metatable))
      J->base[0] = ix.mobj;
    else
      J->base[0] = ix.mt;
  }  /* else: Interpreter will throw. */
}